

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_tattle(REF_CELL ref_cell,REF_INT cell)

{
  int local_18;
  REF_INT node;
  REF_INT cell_local;
  REF_CELL ref_cell_local;
  
  printf("cell %d %d:",(ulong)ref_cell->type,(ulong)(uint)cell);
  for (local_18 = 0; local_18 < ref_cell->size_per; local_18 = local_18 + 1) {
    printf(" %d",(ulong)(uint)ref_cell->c2n[local_18 + ref_cell->size_per * cell]);
  }
  printf("\n");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_tattle(REF_CELL ref_cell, REF_INT cell) {
  REF_INT node;
  printf("cell %d %d:", (int)ref_cell_type(ref_cell), cell);
  for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
    printf(" %d", ref_cell_c2n(ref_cell, node, cell));
  }
  printf("\n");
  return REF_SUCCESS;
}